

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarkContext.cpp
# Opt level: O0

uint __thiscall
Memory::MarkContext::Split(MarkContext *this,uint targetCount,MarkContext **targetContexts)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  uint local_3c;
  uint markStackSplitCount;
  uint i;
  PageStack<Memory::MarkContext::MarkCandidate> *targetMarkStacks [3];
  MarkContext **targetContexts_local;
  uint targetCount_local;
  MarkContext *this_local;
  
  targetMarkStacks[2] = (PageStack<Memory::MarkContext::MarkCandidate> *)targetContexts;
  if (((targetCount == 0) || (3 < targetCount)) || (3 < targetCount)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/MarkContext.cpp"
                       ,0x57,
                       "(targetCount > 0 && targetCount <= PageStack<MarkCandidate>::MaxSplitTargets && targetCount <= PageStack<IRecyclerVisitedObject*>::MaxSplitTargets)"
                       ,
                       "targetCount > 0 && targetCount <= PageStack<MarkCandidate>::MaxSplitTargets && targetCount <= PageStack<IRecyclerVisitedObject*>::MaxSplitTargets"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  for (local_3c = 0; local_3c < targetCount; local_3c = local_3c + 1) {
    *(MarkCandidate **)(&markStackSplitCount + (ulong)local_3c * 2) =
         (&targetMarkStacks[2]->nextEntry)[local_3c] + 1;
  }
  uVar3 = PageStack<Memory::MarkContext::MarkCandidate>::Split
                    (&this->markStack,targetCount,
                     (PageStack<Memory::MarkContext::MarkCandidate> **)&markStackSplitCount);
  return uVar3;
}

Assistant:

uint MarkContext::Split(uint targetCount, __in_ecount(targetCount) MarkContext ** targetContexts)
{
#pragma prefast(suppress:__WARNING_REDUNDANTTEST, "Due to implementation of the PageStack template this test may end up being redundant")
    Assert(targetCount > 0 && targetCount <= PageStack<MarkCandidate>::MaxSplitTargets && targetCount <= PageStack<IRecyclerVisitedObject*>::MaxSplitTargets);
    __analysis_assume(targetCount <= PageStack<MarkCandidate>::MaxSplitTargets);
    __analysis_assume(targetCount <= PageStack<IRecyclerVisitedObject*>::MaxSplitTargets);

    PageStack<MarkCandidate> * targetMarkStacks[PageStack<MarkCandidate>::MaxSplitTargets];
#ifdef RECYCLER_VISITED_HOST
    PageStack<IRecyclerVisitedObject*> * targetPreciseStacks[PageStack<IRecyclerVisitedObject*>::MaxSplitTargets];
#endif

    for (uint i = 0; i < targetCount; i++)
    {
        targetMarkStacks[i] = &targetContexts[i]->markStack;
#ifdef RECYCLER_VISITED_HOST
        targetPreciseStacks[i] = &targetContexts[i]->preciseStack;
#endif
    }

    // Return the max count of the two splits - since the stacks have more or less unrelated sizes, they
    // could yield different number of splits, but the caller wants to know the max parallelism it
    // should use on the results of the split.
    const uint markStackSplitCount = this->markStack.Split(targetCount, targetMarkStacks);
#ifdef RECYCLER_VISITED_HOST
    const uint preciseStackSplitCount = this->preciseStack.Split(targetCount, targetPreciseStacks);
    return max(markStackSplitCount, preciseStackSplitCount);
#else
    return markStackSplitCount;
#endif
}